

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_standard_types.cpp
# Opt level: O0

void __thiscall
StringWriter_WriteCharString_Test::~StringWriter_WriteCharString_Test
          (StringWriter_WriteCharString_Test *this)

{
  StringWriter_WriteCharString_Test *this_local;
  
  ~StringWriter_WriteCharString_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F (StringWriter, WriteCharString) {
    std::string const str{"hello"};
    pstore::serialize::write (writer_, str);

    EXPECT_THAT (bytes_,
                 ::testing::ElementsAre (std::uint8_t{0b1011}, std::uint8_t{0}, std::uint8_t{'h'},
                                         std::uint8_t{'e'}, std::uint8_t{'l'}, std::uint8_t{'l'},
                                         std::uint8_t{'o'}));
    EXPECT_EQ (bytes_.size (), writer_.bytes_consumed ());
    EXPECT_EQ (bytes_.size (), writer_.bytes_produced ());
}